

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_affixes.cpp
# Opt level: O0

bool __thiscall
icu_63::numparse::impl::AffixMatcher::match
          (AffixMatcher *this,StringSegment *segment,ParsedNumber *result,UErrorCode *status)

{
  int iVar1;
  bool bVar2;
  UBool UVar3;
  int iVar4;
  int32_t iVar5;
  UnicodeString local_c0;
  byte local_7d;
  int local_7c;
  undefined1 local_78 [3];
  bool maybeMore_1;
  int initialOffset_1;
  byte local_35;
  int local_34;
  bool maybeMore;
  UErrorCode *pUStack_30;
  int initialOffset;
  UErrorCode *status_local;
  ParsedNumber *result_local;
  StringSegment *segment_local;
  AffixMatcher *this_local;
  
  pUStack_30 = status;
  status_local = (UErrorCode *)result;
  result_local = (ParsedNumber *)segment;
  segment_local = (StringSegment *)this;
  bVar2 = ParsedNumber::seenNumber(result);
  if (bVar2) {
    UVar3 = UnicodeString::isBogus((UnicodeString *)(status_local + 0x26));
    if (((UVar3 != '\0') && (this->fSuffix != (AffixPatternMatcher *)0x0)) &&
       (bVar2 = anon_unknown.dwarf_19932b::matched
                          (this->fPrefix,(UnicodeString *)(status_local + 0x16)), bVar2)) {
      local_7c = StringSegment::getOffset((StringSegment *)result_local);
      iVar4 = (*(this->fSuffix->super_ArraySeriesMatcher).super_SeriesMatcher.
                super_CompositionMatcher.super_NumberParseMatcher._vptr_NumberParseMatcher[3])
                        (this->fSuffix,result_local,status_local,pUStack_30);
      iVar1 = local_7c;
      local_7d = (byte)iVar4 & 1;
      iVar5 = StringSegment::getOffset((StringSegment *)result_local);
      if (iVar1 != iVar5) {
        AffixPatternMatcher::getPattern(&local_c0,this->fSuffix);
        UnicodeString::operator=((UnicodeString *)(status_local + 0x26),&local_c0);
        UnicodeString::~UnicodeString(&local_c0);
      }
      return (bool)(local_7d & 1);
    }
    this_local._7_1_ = false;
  }
  else {
    UVar3 = UnicodeString::isBogus((UnicodeString *)(status_local + 0x16));
    if ((UVar3 == '\0') || (this->fPrefix == (AffixPatternMatcher *)0x0)) {
      this_local._7_1_ = false;
    }
    else {
      local_34 = StringSegment::getOffset((StringSegment *)result_local);
      iVar4 = (*(this->fPrefix->super_ArraySeriesMatcher).super_SeriesMatcher.
                super_CompositionMatcher.super_NumberParseMatcher._vptr_NumberParseMatcher[3])
                        (this->fPrefix,result_local,status_local,pUStack_30);
      iVar1 = local_34;
      local_35 = (byte)iVar4 & 1;
      iVar5 = StringSegment::getOffset((StringSegment *)result_local);
      if (iVar1 != iVar5) {
        AffixPatternMatcher::getPattern((UnicodeString *)local_78,this->fPrefix);
        UnicodeString::operator=((UnicodeString *)(status_local + 0x16),(UnicodeString *)local_78);
        UnicodeString::~UnicodeString((UnicodeString *)local_78);
      }
      this_local._7_1_ = (bool)(local_35 & 1);
    }
  }
  return this_local._7_1_;
}

Assistant:

bool AffixMatcher::match(StringSegment& segment, ParsedNumber& result, UErrorCode& status) const {
    if (!result.seenNumber()) {
        // Prefix
        // Do not match if:
        // 1. We have already seen a prefix (result.prefix != null)
        // 2. The prefix in this AffixMatcher is empty (prefix == null)
        if (!result.prefix.isBogus() || fPrefix == nullptr) {
            return false;
        }

        // Attempt to match the prefix.
        int initialOffset = segment.getOffset();
        bool maybeMore = fPrefix->match(segment, result, status);
        if (initialOffset != segment.getOffset()) {
            result.prefix = fPrefix->getPattern();
        }
        return maybeMore;

    } else {
        // Suffix
        // Do not match if:
        // 1. We have already seen a suffix (result.suffix != null)
        // 2. The suffix in this AffixMatcher is empty (suffix == null)
        // 3. The matched prefix does not equal this AffixMatcher's prefix
        if (!result.suffix.isBogus() || fSuffix == nullptr || !matched(fPrefix, result.prefix)) {
            return false;
        }

        // Attempt to match the suffix.
        int initialOffset = segment.getOffset();
        bool maybeMore = fSuffix->match(segment, result, status);
        if (initialOffset != segment.getOffset()) {
            result.suffix = fSuffix->getPattern();
        }
        return maybeMore;
    }
}